

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModelValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)555>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  bool bVar2;
  long *plVar3;
  Node *pNVar4;
  undefined1 auVar5 [8];
  _Alloc_hider _Var6;
  undefined1 *puVar7;
  Result result;
  const_iterator __begin1;
  undefined1 local_a8 [8];
  _Alloc_hider _Stack_a0;
  undefined1 local_98 [24];
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  undefined1 local_70 [8];
  undefined1 local_68 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>
  local_38;
  
  if (format->_oneof_case_[0] != 0x22b) {
    local_80 = (undefined1  [8])local_70;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_80,"Model not an a CustomModel.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_80);
    auVar5 = local_70;
    _Var6._M_p = (pointer)local_80;
    if (local_80 == (undefined1  [8])local_70) {
      return __return_storage_ptr__;
    }
    goto LAB_00300901;
  }
  puVar7 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar7 == (ModelDescription *)0x0) {
    puVar7 = Specification::_ModelDescription_default_instance_;
  }
  Result::Result((Result *)local_80);
  local_58._M_dataplus._M_p._0_4_ = 0;
  validateModelDescription
            ((Result *)local_a8,(ModelDescription *)puVar7,format->specificationversion_,
             (ValidationPolicy *)(local_68 + 0x10));
  local_80 = local_a8;
  std::__cxx11::string::operator=((string *)&local_78,(string *)&_Stack_a0);
  if (_Stack_a0._M_p != local_98 + 8) {
    operator_delete(_Stack_a0._M_p,local_98._8_8_ + 1);
  }
  bVar2 = Result::good((Result *)local_80);
  if (bVar2) {
    if (format->_oneof_case_[0] == 0x22b) {
      puVar7 = (undefined1 *)(format->Type_).neuralnetworkregressor_;
    }
    else {
      puVar7 = Specification::_CustomModel_default_instance_;
    }
    if (*(long *)(((ulong)((NeuralNetworkRegressor *)puVar7)->updateparams_ & 0xfffffffffffffffe) +
                 8) != 0) {
      _Stack_a0._M_p = (pointer)&((NeuralNetworkRegressor *)puVar7)->layers_;
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
      ::InnerMap::
      iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>
      ::SearchFrom((iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>
                    *)local_a8,
                   (size_type)
                   (((NeuralNetworkRegressor *)puVar7)->preprocessing_).super_RepeatedPtrFieldBase.
                   arena_);
      local_38.bucket_index_ = local_98._0_8_;
      local_38.node_._0_4_ = local_a8._0_4_;
      local_38.node_._4_4_ = local_a8._4_4_;
      local_38.m_._0_4_ = _Stack_a0._M_p._0_4_;
      local_38.m_._4_4_ = _Stack_a0._M_p._4_4_;
      while (__rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(local_38.node_._4_4_,(ResultType)local_38.node_),
            __rhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        if (__rhs->_M_string_length == 0) {
          local_a8 = (undefined1  [8])local_98;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_a8,"CustomModel.parameters must have non-empty string keys.",""
                    );
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
          goto LAB_00300830;
        }
        if (*(int *)((long)&__rhs[1].field_2 + 0xc) == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_68 + 0x10),"CustomModel.parameters[\'",__rhs);
          plVar3 = (long *)std::__cxx11::string::append(local_68 + 0x10);
          pNVar4 = (Node *)(plVar3 + 2);
          if ((Node *)*plVar3 == pNVar4) {
            local_98._0_8_ = *(undefined8 *)pNVar4;
            local_98._8_8_ = plVar3[3];
            local_a8 = (undefined1  [8])local_98;
          }
          else {
            local_98._0_8_ = *(undefined8 *)pNVar4;
            local_a8 = (undefined1  [8])*plVar3;
          }
          _Stack_a0._M_p = (pointer)plVar3[1];
          *plVar3 = (long)pNVar4;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
          if (local_a8 != (undefined1  [8])local_98) {
            operator_delete((void *)local_a8,local_98._0_8_ + 1);
          }
          auVar5 = (undefined1  [8])
                   CONCAT44(local_58._M_dataplus._M_p._4_4_,local_58._M_dataplus._M_p._0_4_);
          if ((Node *)CONCAT44(local_58._M_dataplus._M_p._4_4_,local_58._M_dataplus._M_p._0_4_) ==
              (Node *)&local_58.field_2) goto LAB_003008ee;
          goto LAB_003008e6;
        }
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
        ::InnerMap::
        iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>
        ::operator++(&local_38);
      }
      goto LAB_0030077d;
    }
    local_a8 = (undefined1  [8])local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"CustomModel must have non-empty className.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
LAB_00300830:
    local_58.field_2._M_allocated_capacity = local_98._0_8_;
    auVar5 = local_a8;
    if (local_a8 != (undefined1  [8])local_98) {
LAB_003008e6:
      operator_delete((void *)auVar5,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  else {
LAB_0030077d:
    __return_storage_ptr__->m_type = local_80._0_4_;
    __return_storage_ptr__->m_reason = local_80._4_4_;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((Node *)local_78._M_p == (Node *)(local_70 + 8)) {
      paVar1->_M_allocated_capacity = CONCAT71(local_68._1_7_,local_68[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_68._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_78._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_68._1_7_,local_68[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = (size_type)local_70;
    local_70 = (undefined1  [8])0x0;
    local_68[0] = '\0';
    local_78._M_p = (pointer)(local_70 + 8);
  }
LAB_003008ee:
  if ((Node *)local_78._M_p == (Node *)(local_70 + 8)) {
    return __return_storage_ptr__;
  }
  auVar5 = (undefined1  [8])CONCAT71(local_68._1_7_,local_68[0]);
  _Var6._M_p = local_78._M_p;
LAB_00300901:
  operator_delete(_Var6._M_p,(long)auVar5 + 1);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_customModel>(const Specification::Model& format) {
        const auto& interface = format.description();

        // Make sure that if there is a double output type, there is exactly one output index selected.
        if(!format.has_custommodel()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Model not an a CustomModel.");
        }
        
        Result result;

        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        const auto& customModel = format.custommodel();

        if (customModel.classname().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "CustomModel must have non-empty className.");
        }

        const auto& parameters = customModel.parameters();
        for(const auto& param : parameters) {
            if (param.first.empty()) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "CustomModel.parameters must have non-empty string keys.");
            }

            switch (param.second.value_case()) {
                case Specification::CustomModel_CustomModelParamValue::VALUE_NOT_SET:
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "CustomModel.parameters['"+param.first+"'] does not have a set value");
                default:
                    break;
            }
        }

        return result;
    }